

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

int Cloud_DagCollect_rec(CloudManager *dd,CloudNode *n,int *pCounter)

{
  int iVar1;
  CloudNode **ppCVar2;
  int iVar3;
  int iVar4;
  int eval;
  int tval;
  int *pCounter_local;
  CloudNode *n_local;
  CloudManager *dd_local;
  
  if ((n->v & 0x10000000) == 0) {
    n->v = n->v | 0x10000000;
    if ((n->v & 0xefffffff) == 0xfffffff) {
      ppCVar2 = dd->ppNodes;
      iVar1 = *pCounter;
      *pCounter = iVar1 + 1;
      ppCVar2[iVar1] = n;
      dd_local._4_4_ = 1;
    }
    else {
      iVar3 = Cloud_DagCollect_rec(dd,n->t,pCounter);
      iVar4 = Cloud_DagCollect_rec(dd,(CloudNode *)((ulong)n->e & 0xfffffffffffffffe),pCounter);
      ppCVar2 = dd->ppNodes;
      iVar1 = *pCounter;
      *pCounter = iVar1 + 1;
      ppCVar2[iVar1] = n;
      dd_local._4_4_ = iVar3 + iVar4 + 1;
    }
  }
  else {
    dd_local._4_4_ = 0;
  }
  return dd_local._4_4_;
}

Assistant:

static int Cloud_DagCollect_rec( CloudManager * dd, CloudNode * n, int * pCounter )
{
    int tval, eval;
    if ( cloudNodeIsMarked(n) )
        return 0;
    // set visited flag
    cloudNodeMark(n);
    if ( cloudIsConstant(n) )
    {
        dd->ppNodes[(*pCounter)++] = n;
        return 1;
    }
    tval = Cloud_DagCollect_rec( dd, cloudT(n), pCounter );
    eval = Cloud_DagCollect_rec( dd, Cloud_Regular(cloudE(n)), pCounter );
    dd->ppNodes[(*pCounter)++] = n;
    return tval + eval + 1;

}